

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::MultiVertexArrayStorageTests::init
          (MultiVertexArrayStorageTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  Spec local_70;
  int local_44;
  undefined1 local_40 [4];
  int arrayCountNdx;
  Spec spec;
  int arrayCounts [1];
  MultiVertexArrayStorageTests *this_local;
  
  spec.arrays.
  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
  deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_40);
  local_40 = (undefined1  [4])0x1;
  arrayCountNdx = 0x100;
  spec.primitive = PRIMITIVE_POINTS;
  for (local_44 = 0; local_44 < 1; local_44 = local_44 + 1) {
    deqp::gls::MultiVertexArrayTest::Spec::Spec(&local_70,(Spec *)local_40);
    addStorageCases(this,&local_70,
                    *(int *)((long)&spec.arrays.
                                    super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage +
                            (long)local_44 * 4 + 4U));
    deqp::gls::MultiVertexArrayTest::Spec::~Spec(&local_70);
  }
  deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_40);
  return extraout_EAX;
}

Assistant:

void MultiVertexArrayStorageTests::init (void)
{
	// Test different storages
	int arrayCounts[] = {3};

	MultiVertexArrayTest::Spec spec;

	spec.primitive	= Array::PRIMITIVE_TRIANGLES;
	spec.drawCount	= 256;
	spec.first		= 0;

	for (int arrayCountNdx = 0; arrayCountNdx < DE_LENGTH_OF_ARRAY(arrayCounts); arrayCountNdx++)
		addStorageCases(spec, arrayCounts[arrayCountNdx]);
}